

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

char * curl_pushheader_bynum(curl_pushheaders *h,size_t num)

{
  void *local_30;
  stream_ctx *stream;
  size_t num_local;
  curl_pushheaders *h_local;
  
  if (((h == (curl_pushheaders *)0x0) || (h->data == (Curl_easy *)0x0)) ||
     (h->data->magic != 0xc0dedbad)) {
    h_local = (curl_pushheaders *)0x0;
  }
  else {
    if ((h->data == (Curl_easy *)0x0) || ((h->data->req).p.file == (FILEPROTO *)0x0)) {
      local_30 = (void *)0x0;
    }
    else {
      local_30 = (((h->data->req).p.rtsp)->http_wrapper).h2_ctx;
    }
    if ((local_30 == (void *)0x0) || (*(ulong *)((long)local_30 + 0x130) <= num)) {
      h_local = (curl_pushheaders *)0x0;
    }
    else {
      h_local = *(curl_pushheaders **)(*(long *)((long)local_30 + 0x128) + num * 8);
    }
  }
  return (char *)h_local;
}

Assistant:

char *curl_pushheader_bynum(struct curl_pushheaders *h, size_t num)
{
  /* Verify that we got a good easy handle in the push header struct, mostly to
     detect rubbish input fast(er). */
  if(!h || !GOOD_EASY_HANDLE(h->data))
    return NULL;
  else {
    struct stream_ctx *stream = H2_STREAM_CTX(h->data);
    if(stream && num < stream->push_headers_used)
      return stream->push_headers[num];
  }
  return NULL;
}